

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

int64_t __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::get_int64_value(basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
                  *this,error_code *ec)

{
  size_t *psVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  uint64_t uVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  uint8_t b;
  uint8_t buf_2 [2];
  uint8_t buf [4];
  uint8_t buf_1 [8];
  byte local_2f;
  ushort local_2e;
  uint local_2c;
  ulong local_28;
  
  pbVar2 = (this->source_).current_._M_current;
  pbVar3 = (this->source_).end_._M_current;
  if (pbVar2 == pbVar3) {
    uVar5 = 0x100;
  }
  else {
    uVar5 = (uint)*pbVar2;
  }
  if (0xff < uVar5) {
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
    return 0;
  }
  bVar8 = (byte)uVar5 >> 5;
  if (bVar8 == 0) {
    uVar6 = get_uint64_value(this,ec);
    if ((long)uVar6 < 1) {
      uVar6 = 0;
    }
    if (ec->_M_value == 0) {
      return uVar6;
    }
    return 0;
  }
  if (bVar8 != 1) {
LAB_002b1785:
    return 0;
  }
  bVar8 = (byte)uVar5 & 0x1f;
  if (pbVar2 != pbVar3) {
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + 1;
    (this->source_).current_._M_current = pbVar2 + 1;
  }
  if (bVar8 < 0x18) {
    return (long)(char)~bVar8;
  }
  switch(bVar8) {
  case 0x18:
    pbVar2 = (this->source_).current_._M_current;
    uVar7 = (ulong)(pbVar3 != pbVar2);
    if (pbVar3 == pbVar2) {
      psVar1 = &(this->source_).position_;
      *psVar1 = *psVar1 + uVar7;
LAB_002b18fe:
      std::error_code::operator=(ec,unexpected_eof);
      this->more_ = false;
      uVar7 = 0;
    }
    else {
      uVar9 = 0;
      pbVar4 = pbVar2;
      do {
        (this->source_).current_._M_current = pbVar4 + 1;
        (&local_2f)[uVar9] = *pbVar4;
        uVar9 = uVar9 + 1;
        pbVar4 = pbVar4 + 1;
      } while (uVar7 != uVar9);
      psVar1 = &(this->source_).position_;
      *psVar1 = *psVar1 + uVar7;
      if (pbVar3 == pbVar2) goto LAB_002b18fe;
      uVar7 = ~(ulong)local_2f;
    }
    if (pbVar3 == pbVar2) {
      return 0;
    }
    break;
  case 0x19:
    pbVar2 = (this->source_).current_._M_current;
    uVar7 = 2;
    if ((ulong)((long)pbVar3 - (long)pbVar2) < 2) {
      uVar7 = (long)pbVar3 - (long)pbVar2;
    }
    if (pbVar3 != pbVar2) {
      uVar9 = 0;
      pbVar4 = pbVar2;
      do {
        (this->source_).current_._M_current = pbVar4 + 1;
        *(byte *)((long)&local_2e + uVar9) = *pbVar4;
        uVar9 = uVar9 + 1;
        pbVar4 = pbVar4 + 1;
      } while (uVar7 != uVar9);
    }
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + uVar7;
    if ((ulong)((long)pbVar3 - (long)pbVar2) < 2) {
      std::error_code::operator=(ec,unexpected_eof);
      this->more_ = false;
      return 0;
    }
    return ~(ulong)(ushort)(local_2e << 8 | local_2e >> 8);
  case 0x1a:
    pbVar2 = (this->source_).current_._M_current;
    uVar7 = 4;
    if ((ulong)((long)pbVar3 - (long)pbVar2) < 4) {
      uVar7 = (long)pbVar3 - (long)pbVar2;
    }
    if (pbVar3 != pbVar2) {
      uVar9 = 0;
      pbVar4 = pbVar2;
      do {
        (this->source_).current_._M_current = pbVar4 + 1;
        *(byte *)((long)&local_2c + uVar9) = *pbVar4;
        uVar9 = uVar9 + 1;
        pbVar4 = pbVar4 + 1;
      } while (uVar7 != uVar9);
    }
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + uVar7;
    if ((ulong)((long)pbVar3 - (long)pbVar2) < 4) {
      std::error_code::operator=(ec,unexpected_eof);
      this->more_ = false;
      return 0;
    }
    uVar7 = ~(ulong)(local_2c >> 0x18 | (local_2c & 0xff0000) >> 8 | (local_2c & 0xff00) << 8 |
                    local_2c << 0x18);
    break;
  case 0x1b:
    pbVar2 = (this->source_).current_._M_current;
    uVar7 = 8;
    if ((ulong)((long)pbVar3 - (long)pbVar2) < 8) {
      uVar7 = (long)pbVar3 - (long)pbVar2;
    }
    if (pbVar3 != pbVar2) {
      uVar9 = 0;
      pbVar4 = pbVar2;
      do {
        (this->source_).current_._M_current = pbVar4 + 1;
        *(byte *)((long)&local_28 + uVar9) = *pbVar4;
        uVar9 = uVar9 + 1;
        pbVar4 = pbVar4 + 1;
      } while (uVar7 != uVar9);
    }
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + uVar7;
    if ((ulong)((long)pbVar3 - (long)pbVar2) < 8) {
      std::error_code::operator=(ec,unexpected_eof);
      this->more_ = false;
      return 0;
    }
    uVar7 = ~local_28;
    uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
            (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
            (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
    break;
  default:
    goto LAB_002b1785;
  }
  return uVar7;
}

Assistant:

int64_t get_int64_value(std::error_code& ec)
    {
        int64_t val = 0;

        auto ch = source_.peek();
        if (ch.eof)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return val;
        }

        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(ch.value);
        uint8_t info = get_additional_information_value(ch.value);
        switch (major_type)
        {
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
                source_.ignore(1);
                switch (info)
                {
                    case JSONCONS_EXT_CBOR_0x00_0x17: // 0x00..0x17 (0..23)
                    {
                        val = static_cast<int8_t>(- 1 - info);
                        break;
                    }
                    case 0x18: // Negative integer (one-byte uint8_t follows)
                        {
                            uint8_t b;
                            if (source_.read(&b, 1) == 0)
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            val = static_cast<int64_t>(-1) - static_cast<int64_t>(b);
                            break;
                        }

                    case 0x19: // Negative integer -1-n (two-byte uint16_t follows)
                        {
                            uint8_t buf[sizeof(uint16_t)];
                            if (source_.read(buf, sizeof(uint16_t)) != sizeof(uint16_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint16_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1a: // Negative integer -1-n (four-byte uint32_t follows)
                        {
                            uint8_t buf[sizeof(uint32_t)];
                            if (source_.read(buf, sizeof(uint32_t)) != sizeof(uint32_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint32_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1b: // Negative integer -1-n (eight-byte uint64_t follows)
                        {
                            uint8_t buf[sizeof(uint64_t)];
                            if (source_.read(buf, sizeof(uint64_t)) != sizeof(uint64_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint64_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- static_cast<int64_t>(x);
                            break;
                        }
                }
                break;

                case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
                {
                    uint64_t x = get_uint64_value(ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return 0;
                    }
                    if (x <= static_cast<uint64_t>((std::numeric_limits<int64_t>::max)()))
                    {
                        val = x;
                    }
                    else
                    {
                        // error;
                    }
                    
                    break;
                }
                break;
            default:
                break;
        }

        return val;
    }